

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void notch::core::connect<notch::core::FullyConnectedLayer,notch::core::EuclideanLoss>
               (FullyConnectedLayer *prevLayer,EuclideanLoss *nextLayer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar4;
  invalid_argument *this;
  SharedBuffers *pSVar5;
  shared_ptr<std::valarray<float>_> local_238;
  undefined1 local_221;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream ss;
  size_t nextOut;
  size_t nextIn;
  size_t prevOut;
  size_t prevIn;
  EuclideanLoss *nextLayer_local;
  FullyConnectedLayer *prevLayer_local;
  ulong nOutputs;
  
  iVar1 = (*(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer[1])();
  iVar2 = (*(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer[2])();
  nOutputs = CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*(nextLayer->super_ALossLayer)._vptr_ALossLayer[4])();
  iVar3 = (*(nextLayer->super_ALossLayer)._vptr_ALossLayer[5])();
  if (nOutputs != CONCAT44(extraout_var_01,iVar2)) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar4 = ::std::operator<<((ostream *)local_1b0,"can\'t connect ");
    (**(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer)(local_1e0);
    poVar4 = ::std::operator<<(poVar4,local_1e0);
    poVar4 = ::std::operator<<(poVar4," ");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,CONCAT44(extraout_var,iVar1));
    poVar4 = ::std::operator<<(poVar4," in/");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,nOutputs);
    poVar4 = ::std::operator<<(poVar4," out");
    poVar4 = ::std::operator<<(poVar4," to ");
    (**(nextLayer->super_ALossLayer)._vptr_ALossLayer)(local_200);
    poVar4 = ::std::operator<<(poVar4,local_200);
    poVar4 = ::std::operator<<(poVar4," ");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,CONCAT44(extraout_var_01,iVar2));
    poVar4 = ::std::operator<<(poVar4," in/");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,CONCAT44(extraout_var_02,iVar3));
    ::std::operator<<(poVar4," out");
    ::std::__cxx11::string::~string(local_200);
    ::std::__cxx11::string::~string(local_1e0);
    local_221 = 1;
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::ostringstream::str();
    ::std::invalid_argument::invalid_argument(this,local_220);
    local_221 = 0;
    __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
  }
  pSVar5 = GetShared<notch::core::FullyConnectedLayer>::ref(prevLayer);
  SharedBuffers::allocate(pSVar5,CONCAT44(extraout_var,iVar1),nOutputs);
  (*(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer[5])(&local_238);
  pSVar5 = GetShared<notch::core::EuclideanLoss>::ref(nextLayer);
  std::shared_ptr<std::valarray<float>_>::operator=(&pSVar5->inputBuffer,&local_238);
  std::shared_ptr<std::valarray<float>_>::~shared_ptr(&local_238);
  return;
}

Assistant:

void connect(PREV_LAYER &prevLayer, NEXT_LAYER &nextLayer) {
    size_t prevIn = prevLayer.inputDim();
    size_t prevOut = prevLayer.outputDim();
    size_t nextIn = nextLayer.inputDim();
    size_t nextOut = nextLayer.outputDim();
    if (prevOut != nextIn) {
        std::ostringstream ss;
        ss << "can't connect " << prevLayer.tag() << " "
           << prevIn << " in/" << prevOut << " out"
           << " to " << nextLayer.tag() << " "
           << nextIn << " in/" << nextOut << " out";
        throw std::invalid_argument(ss.str());
    }
    GetShared<PREV_LAYER>::ref(prevLayer).allocate(prevIn, prevOut);
    GetShared<NEXT_LAYER>::ref(nextLayer).inputBuffer = prevLayer.getOutputBuffer();
}